

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_freeDCtx(ZSTD_DCtx *dctx)

{
  ZSTD_freeFunction p_Var1;
  void *pvVar2;
  ZSTD_DDictHashSet *__ptr;
  ZSTD_DDict **__ptr_00;
  ZSTD_customMem customMem;
  
  if (dctx == (ZSTD_DCtx *)0x0) {
    return 0;
  }
  if (dctx->staticSize != 0) {
    return 0xffffffffffffffc0;
  }
  p_Var1 = (dctx->customMem).customFree;
  pvVar2 = (dctx->customMem).opaque;
  customMem = dctx->customMem;
  ZSTD_clearDict(dctx);
  ZSTD_customFree(dctx->inBuff,customMem);
  dctx->inBuff = (char *)0x0;
  __ptr = dctx->ddictSet;
  if (__ptr == (ZSTD_DDictHashSet *)0x0) goto LAB_003b71ac;
  __ptr_00 = __ptr->ddictPtrTable;
  if (__ptr_00 == (ZSTD_DDict **)0x0) {
    if (p_Var1 != (ZSTD_freeFunction)0x0) goto LAB_003b7189;
LAB_003b719c:
    free(__ptr);
  }
  else {
    if (p_Var1 == (ZSTD_freeFunction)0x0) {
      free(__ptr_00);
      goto LAB_003b719c;
    }
    (*p_Var1)(pvVar2,__ptr_00);
LAB_003b7189:
    (*p_Var1)(pvVar2,__ptr);
  }
  dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
LAB_003b71ac:
  if (p_Var1 == (ZSTD_freeFunction)0x0) {
    free(dctx);
  }
  else {
    (*p_Var1)(pvVar2,dctx);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeDCtx(ZSTD_DCtx* dctx)
{
    if (dctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(dctx->staticSize, memory_allocation, "not compatible with static DCtx");
    {   ZSTD_customMem const cMem = dctx->customMem;
        ZSTD_clearDict(dctx);
        ZSTD_customFree(dctx->inBuff, cMem);
        dctx->inBuff = NULL;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (dctx->legacyContext)
            ZSTD_freeLegacyStreamContext(dctx->legacyContext, dctx->previousLegacyVersion);
#endif
        if (dctx->ddictSet) {
            ZSTD_freeDDictHashSet(dctx->ddictSet, cMem);
            dctx->ddictSet = NULL;
        }
        ZSTD_customFree(dctx, cMem);
        return 0;
    }
}